

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O2

Result host_gl_shader(GLenum type,GLchar *source,GLuint *out_shader)

{
  GLuint GVar1;
  GLchar *pGVar2;
  char *pcVar3;
  Result RVar4;
  GLint length;
  GLint status;
  GLchar *sources [2];
  char version [128];
  
  if ((type & 0xfffffffe) == 0x8b30) {
    GVar1 = (*glCreateShader)(type);
    host_gl_shader_version();
    RVar4 = OK;
    snprintf(version,0x7f,"#version %d\n");
    sources[0] = version;
    sources[1] = source;
    (*glShaderSource)(GVar1,2,sources,(GLint *)0x0);
    (*glCompileShader)(GVar1);
    (*glGetShaderiv)(GVar1,0x8b81,&status);
    if (status == 0) {
      (*glGetShaderiv)(GVar1,0x8b84,&length);
      pGVar2 = (GLchar *)malloc((long)length + 1);
      (*glGetShaderInfoLog)(GVar1,length,(GLsizei *)0x0,pGVar2);
      pcVar3 = "GL_FRAGMENT_SHADER";
      if (type == 0x8b31) {
        pcVar3 = "GL_VERTEX_SHADER";
      }
      fprintf(_stderr,"%s ERROR: %s\n",pcVar3,pGVar2);
      RVar4 = ERROR;
    }
    else {
      *out_shader = GVar1;
    }
    return RVar4;
  }
  __assert_fail("type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host-gl.c",
                0x28,"Result host_gl_shader(GLenum, const GLchar *, GLuint *)");
}

Assistant:

Result host_gl_shader(GLenum type, const GLchar* source, GLuint* out_shader) {
  assert(type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER);
  GLuint shader = glCreateShader(type);
  char version[128];
  snprintf(version, sizeof(version) - 1, "#version %d\n",
           host_gl_shader_version());
  const GLchar* sources[] = {version, source};
  glShaderSource(shader, 2, sources, NULL);
  glCompileShader(shader);
  CHECK_LOG(shader, Shader, GL_COMPILE_STATUS, type == GL_VERTEX_SHADER
                                                   ? "GL_VERTEX_SHADER"
                                                   : "GL_FRAGMENT_SHADER");
  *out_shader = shader;
  return OK;
  ON_ERROR_RETURN;
}